

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

int __thiscall nite::UDPSocket::open(UDPSocket *this,char *__file,int __oflag,...)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int number;
  int number_00;
  undefined8 unaff_RBX;
  undefined1 local_f0 [8];
  sockaddr_in addr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  uVar1 = (ushort)__file;
  this->port = uVar1;
  iVar2 = socket(2,2,0x11);
  this->sock = iVar2;
  if (iVar2 < 0) {
    print("failed to create UDP socket");
    iVar2 = 0;
  }
  else {
    local_f0._0_2_ = 2;
    local_f0[4] = '\0';
    local_f0[5] = '\0';
    local_f0[6] = '\0';
    local_f0[7] = '\0';
    local_f0._2_2_ = uVar1 << 8 | uVar1 >> 8;
    iVar3 = bind(iVar2,(sockaddr *)local_f0,0x10);
    iVar2 = (int)CONCAT71((int7)((ulong)unaff_RBX >> 8),iVar3 < 1);
    if (iVar3 < 1) {
      this->opened = true;
      toStr_abi_cxx11_((string *)addr.sin_zero,(nite *)((ulong)__file & 0xffff),number);
      std::operator+(&local_a0,"UDP socket opened at ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     addr.sin_zero);
      std::operator+(&local_c0,&local_a0," (");
      toStr_abi_cxx11_(&local_80,(nite *)(ulong)(uint)this->sock,number_00);
      std::operator+(&local_60,&local_c0,&local_80);
      std::operator+(&local_40,&local_60,")");
      print(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)addr.sin_zero);
    }
    else {
      toStr_abi_cxx11_(&local_60,(nite *)((ulong)__file & 0xffff),number);
      std::operator+(&local_40,"failed to bind UDP socket to port ",&local_60);
      print(&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::__cxx11::string::~string((string *)&local_60);
      ::close(this->sock);
    }
  }
  return iVar2;
}

Assistant:

bool nite::UDPSocket::open(UInt16 port){
	this->port = port;
	if((sock = socket(AF_INET, SOCK_DGRAM, IPPROTO_UDP)) < 0){
		nite::print("failed to create UDP socket"); // TODO: add proper error handling
		return false;
	}
	sockaddr_in addr;
	addr.sin_family = AF_INET;
	addr.sin_addr.s_addr = INADDR_ANY;
	addr.sin_port = htons(port);
	if (bind(sock, (const sockaddr*) &addr, sizeof(sockaddr_in)) > 0){
 		nite::print("failed to bind UDP socket to port "+nite::toStr(port)); // TODO: add proper error handling
		close_(sock);
		return false;
	}
	opened = true;
	nite::print("UDP socket opened at "+nite::toStr(port)+" ("+nite::toStr(sock)+")");
	return true;
}